

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes,string *outputConfig)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmGeneratorTarget *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  int iVar4;
  cmGlobalNinjaGenerator *pcVar5;
  cmake *this_01;
  string *psVar6;
  cmLocalNinjaGenerator *pcVar7;
  undefined4 extraout_var;
  pointer this_02;
  string_view sVar8;
  cmOutputConverter *local_6c8;
  string local_5c8;
  undefined1 local_5a8 [8];
  string cmdLine;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string *compileCmd;
  cmAlphaNum local_518;
  undefined1 local_4e8 [8];
  string cmdVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  cmAlphaNum local_480;
  string local_450;
  allocator<char> local_429;
  string local_428;
  string *local_408;
  string *wholeFlag;
  cmAlphaNum local_3d0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string *local_358;
  string *ptxFlag;
  string local_348;
  cmAlphaNum local_328;
  cmAlphaNum local_2f8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string *local_280;
  string *rdcFlag;
  string local_270;
  undefined1 local_250 [8];
  string cudaCompileMode;
  string local_220;
  string local_200;
  undefined1 local_1e0 [8];
  string escapedSourceFileName;
  RuleVariables compileObjectVars;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *objectFileDir_local;
  string *objectFileName_local;
  string *objectDir_local;
  string *sourceFileName_local;
  string *language_local;
  cmNinjaTargetGenerator *this_local;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_38 = objectFileDir;
  objectFileDir_local = objectFileName;
  objectFileName_local = objectDir;
  objectDir_local = sourceFileName;
  sourceFileName_local = language;
  language_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"EXPORT_COMPILE_COMMANDS",&local_59);
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&escapedSourceFileName.field_2 + 8));
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)local_1e0,(string *)objectDir_local);
    bVar3 = cmsys::SystemTools::FileIsFullPath(objectDir_local);
    if (!bVar3) {
      pcVar5 = GetGlobalGenerator(this);
      this_01 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)pcVar5);
      psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_(this_01);
      cmsys::SystemTools::CollapseFullPath(&local_200,(string *)local_1e0,psVar6);
      std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
    }
    pcVar7 = this->LocalGenerator;
    sVar8 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1e0);
    cudaCompileMode.field_2._8_8_ = sVar8._M_len;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_220,
               &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,sVar8,SHELL);
    std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)local_250);
    bVar3 = std::operator==(sourceFileName_local,"CUDA");
    if (bVar3) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"CUDA_SEPARABLE_COMPILATION",
                 (allocator<char> *)((long)&rdcFlag + 7));
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator((allocator<char> *)((long)&rdcFlag + 7));
      if (bVar3) {
        pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"_CMAKE_CUDA_RDC_FLAG",&local_2a1);
        psVar6 = cmMakefile::GetRequiredDefinition(pcVar2,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator(&local_2a1);
        local_280 = psVar6;
        cmAlphaNum::cmAlphaNum(&local_2f8,(string *)local_250);
        cmAlphaNum::cmAlphaNum(&local_328,local_280);
        cmStrCat<char[2]>(&local_2c8,&local_2f8,&local_328,(char (*) [2])0xd54427);
        std::__cxx11::string::operator=((string *)local_250,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
      }
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"CUDA_PTX_COMPILATION",(allocator<char> *)((long)&ptxFlag + 7)
                );
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ptxFlag + 7));
      if (bVar3) {
        pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,"_CMAKE_CUDA_PTX_FLAG",&local_379);
        psVar6 = cmMakefile::GetRequiredDefinition(pcVar2,&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        std::allocator<char>::~allocator(&local_379);
        local_358 = psVar6;
        cmAlphaNum::cmAlphaNum(&local_3d0,(string *)local_250);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&wholeFlag,local_358);
        cmStrCat<>(&local_3a0,&local_3d0,(cmAlphaNum *)&wholeFlag);
        std::__cxx11::string::operator=((string *)local_250,(string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
      }
      else {
        pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"_CMAKE_CUDA_WHOLE_FLAG",&local_429);
        psVar6 = cmMakefile::GetRequiredDefinition(pcVar2,&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::allocator<char>::~allocator(&local_429);
        local_408 = psVar6;
        cmAlphaNum::cmAlphaNum(&local_480,(string *)local_250);
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)
                   &compileCmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_408);
        cmStrCat<>(&local_450,&local_480,
                   (cmAlphaNum *)
                   &compileCmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=((string *)local_250,(string *)&local_450);
        std::__cxx11::string::~string((string *)&local_450);
      }
      std::__cxx11::string::c_str();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&cmdVar.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_518,"CMAKE_");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&compileCmd,sourceFileName_local);
    cmStrCat<char[16]>((string *)local_4e8,&local_518,(cmAlphaNum *)&compileCmd,
                       (char (*) [16])"_COMPILE_OBJECT");
    psVar6 = cmMakefile::GetRequiredDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_4e8);
    sVar8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    rulePlaceholderExpander._M_t.
    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>,_true,_true>
          )sVar8._M_len;
    cmExpandList(sVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&cmdVar.field_2 + 8),false);
    pcVar7 = GetLocalGenerator(this);
    iVar4 = (*(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
    unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
              ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                *)&__range1,(pointer)CONCAT44(extraout_var,iVar4));
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&cmdVar.field_2 + 8);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar3) {
      cmdLine.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      this_02 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&__range1);
      pcVar7 = GetLocalGenerator(this);
      local_6c8 = (cmOutputConverter *)0x0;
      if (pcVar7 != (cmLocalNinjaGenerator *)0x0) {
        local_6c8 = &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_02,local_6c8,(string *)cmdLine.field_2._8_8_,
                 (RuleVariables *)((long)&escapedSourceFileName.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pcVar7 = GetLocalGenerator(this);
    std::__cxx11::string::string((string *)&local_5c8);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_5a8,pcVar7,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cmdVar.field_2 + 8),outputConfig,outputConfig,&local_5c8,
               (cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&local_5c8);
    pcVar5 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddCXXCompileCommand
              (pcVar5,(string *)local_5a8,objectDir_local,objectFileDir_local);
    std::__cxx11::string::~string((string *)local_5a8);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&__range1);
    std::__cxx11::string::~string((string *)local_4e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&cmdVar.field_2 + 8));
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string((string *)local_1e0);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes,
  std::string const& outputConfig)
{
  if (!this->GeneratorTarget->GetPropertyAsBool("EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    escapedSourceFileName =
      cmSystemTools::CollapseFullPath(escapedSourceFileName,
                                      this->GetGlobalGenerator()
                                        ->GetCMakeInstance()
                                        ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Rule for compiling object file.
  std::string cudaCompileMode;
  if (language == "CUDA") {
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      const std::string& rdcFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_RDC_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, rdcFlag, " ");
    }
    if (this->GeneratorTarget->GetPropertyAsBool("CUDA_PTX_COMPILATION")) {
      const std::string& ptxFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_PTX_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, ptxFlag);
    } else {
      const std::string& wholeFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_WHOLE_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, wholeFlag);
    }
    compileObjectVars.CudaCompileMode = cudaCompileMode.c_str();
  }

  std::vector<std::string> compileCmds;
  const std::string cmdVar = cmStrCat("CMAKE_", language, "_COMPILE_OBJECT");
  const std::string& compileCmd =
    this->Makefile->GetRequiredDefinition(cmdVar);
  cmExpandList(compileCmd, compileCmds);

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  for (std::string& i : compileCmds) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 compileObjectVars);
  }

  std::string cmdLine = this->GetLocalGenerator()->BuildCommandLine(
    compileCmds, outputConfig, outputConfig);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName,
                                                   objectFileName);
}